

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O3

void BuildHistograms(uint8_t *input,size_t start_pos,size_t mask,Command *commands,size_t n_commands
                    ,HistogramLiteral *lit_histo,HistogramCommand *cmd_histo,
                    HistogramDistance *dist_histo)

{
  ushort uVar1;
  ushort uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t pos;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  
  if (n_commands != 0) {
    sVar5 = cmd_histo->total_count_;
    sVar3 = 0;
    do {
      uVar6 = (ulong)commands[sVar3].insert_len_;
      uVar7 = commands[sVar3].copy_len_;
      uVar1 = commands[sVar3].cmd_prefix_;
      uVar2 = commands[sVar3].dist_prefix_;
      cmd_histo->data_[uVar1] = cmd_histo->data_[uVar1] + 1;
      sVar5 = sVar5 + 1;
      cmd_histo->total_count_ = sVar5;
      if (uVar6 != 0) {
        sVar4 = lit_histo->total_count_;
        do {
          sVar4 = sVar4 + 1;
          lit_histo->data_[input[start_pos & mask]] = lit_histo->data_[input[start_pos & mask]] + 1;
          lit_histo->total_count_ = sVar4;
          start_pos = start_pos + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      uVar7 = uVar7 & 0xffffff;
      if ((uVar7 != 0) && (0x7f < uVar1)) {
        dist_histo->data_[uVar2] = dist_histo->data_[uVar2] + 1;
        dist_histo->total_count_ = dist_histo->total_count_ + 1;
      }
      start_pos = start_pos + uVar7;
      sVar3 = sVar3 + 1;
    } while (sVar3 != n_commands);
  }
  return;
}

Assistant:

static void BuildHistograms(const uint8_t* input,
                            size_t start_pos,
                            size_t mask,
                            const Command *commands,
                            size_t n_commands,
                            HistogramLiteral* lit_histo,
                            HistogramCommand* cmd_histo,
                            HistogramDistance* dist_histo) {
  size_t pos = start_pos;
  size_t i;
  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    size_t j;
    HistogramAddCommand(cmd_histo, cmd.cmd_prefix_);
    for (j = cmd.insert_len_; j != 0; --j) {
      HistogramAddLiteral(lit_histo, input[pos & mask]);
      ++pos;
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd) && cmd.cmd_prefix_ >= 128) {
      HistogramAddDistance(dist_histo, cmd.dist_prefix_);
    }
  }
}